

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::FullyConnectedLayer::calcPropagatedErrors(FullyConnectedLayer *this)

{
  size_t sVar1;
  float *pfVar2;
  element_type *__va;
  float *pfVar3;
  float *y_begin;
  float fVar4;
  float *e_j;
  size_t j;
  float *delta_begin;
  float *w_begin;
  float *e_begin;
  FullyConnectedLayer *this_local;
  
  sVar1 = std::valarray<float>::size(&this->propagatedErrors);
  if (sVar1 != this->nInputs) {
    std::valarray<float>::resize(&this->propagatedErrors,this->nInputs,0.0);
  }
  pfVar2 = std::begin<float>(&this->propagatedErrors);
  __va = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->weights);
  pfVar3 = std::begin<float>(__va);
  y_begin = std::begin<float>(&this->localGrad);
  for (e_j = (float *)0x0; e_j < (float *)this->nInputs; e_j = (float *)((long)e_j + 1)) {
    fVar4 = internal::dot<float*,float*>(this->nOutputs,pfVar3 + (long)e_j,this->nInputs,y_begin,1);
    pfVar2[(long)e_j] = fVar4;
  }
  return;
}

Assistant:

void calcPropagatedErrors() {
        if (propagatedErrors.size() != nInputs) {
            propagatedErrors.resize(nInputs);
        }
        // propagated errors are dot products between columns of the
        // weight matrix $w_{kj} and local gradient $\\delta_j$;
        auto e_begin = std::begin(propagatedErrors); // points to e_0
        auto w_begin = std::begin(*weights);         // points to w_00
        auto delta_begin = std::begin(localGrad);    // points to delta_0
        for (size_t j = 0; j < nInputs; ++j) { // for all inputs
            float &e_j = *(e_begin + j);
            e_j = internal::dot(nOutputs, w_begin + j, nInputs, delta_begin, 1);
        }
    }